

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

secp256k1_scratch_space * secp256k1_scratch_space_create(secp256k1_context *ctx,size_t max_size)

{
  secp256k1_scratch *psVar1;
  
  psVar1 = secp256k1_scratch_create(&ctx->error_callback,max_size);
  return psVar1;
}

Assistant:

secp256k1_scratch_space* secp256k1_scratch_space_create(const secp256k1_context* ctx, size_t max_size) {
    VERIFY_CHECK(ctx != NULL);
    return secp256k1_scratch_create(&ctx->error_callback, max_size);
}